

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed25519-sha512.c
# Opt level: O1

void genpub(uint8_t *pub,uint8_t *sec)

{
  sc_t a;
  uint8_t h [64];
  ed A;
  limb_t alStack_128 [6];
  uint8_t local_f8 [64];
  ed local_b8;
  
  ed25519_key_setup(local_f8,sec);
  sc_import(alStack_128,local_f8,0x20);
  ed_scale_base(&local_b8,alStack_128);
  ed_export(pub,&local_b8);
  return;
}

Assistant:

static void
genpub(uint8_t pub[ED25519_KEY_LEN], const uint8_t sec[ED25519_KEY_LEN])
{
	uint8_t h[SHA512_HASH_LENGTH];
	struct ed A;
	sc_t a;

	/* derive secret and import it */
	ed25519_key_setup(h, sec);
	sc_import(a, h, 32);

	/* multiply with base point to calculate public key */
	ed_scale_base(&A, a);
	ed_export(pub, &A);
}